

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::GeneratorDebugVisitor::~GeneratorDebugVisitor(GeneratorDebugVisitor *this)

{
  ~GeneratorDebugVisitor(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

void visit(Generator *generator) override {
        if (result_.find(generator->name) != result_.end()) return;
        if (!generator->fn_name_ln.empty()) {
            DebugInfoVisitor visitor;
            visitor.result().emplace(1, generator->fn_name_ln);
            visitor.visit_content(generator);
            result_.emplace(generator->name, visitor.result());
        }
    }